

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<ComponentInfo>::reallocateAndGrow
          (QArrayDataPointer<ComponentInfo> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<ComponentInfo> *old)

{
  Data *pDVar1;
  long lVar2;
  ComponentInfo *pCVar3;
  long lVar4;
  Int IVar5;
  long lVar6;
  ComponentInfo *pCVar7;
  qsizetype qVar8;
  ComponentInfo *pCVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<ComponentInfo> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = this->d;
  if (pDVar1 == (Data *)0x0) {
    qVar8 = 0;
  }
  else {
    qVar8 = (pDVar1->super_QArrayData).alloc;
  }
  if (qVar8 < this->size) {
    qVar8 = this->size;
  }
  if (where == GrowsAtEnd) {
    lVar2 = freeSpaceAtEnd(this);
  }
  else {
    lVar2 = freeSpaceAtBegin(this);
  }
  lVar2 = (qVar8 + n) - lVar2;
  if (pDVar1 == (Data *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (pDVar1->super_QArrayData).alloc;
    lVar6 = lVar2;
    if (lVar2 < lVar4) {
      lVar6 = lVar4;
    }
    if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
      lVar2 = lVar6;
    }
  }
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  pCVar3 = (ComponentInfo *)
           QArrayData::allocate((QArrayData **)&local_58,0x30,0x10,lVar2,(uint)(lVar2 <= lVar4));
  pDVar1 = local_58.d;
  if (pCVar3 != (ComponentInfo *)0x0 && local_58.d != (Data *)0x0) {
    if (where == GrowsAtBeginning) {
      lVar4 = (((local_58.d)->super_QArrayData).alloc - (this->size + n)) / 2;
      lVar2 = 0;
      if (0 < lVar4) {
        lVar2 = lVar4;
      }
      lVar2 = lVar2 + n;
    }
    else {
      lVar2 = freeSpaceAtBegin(this);
    }
    if (this->d == (Data *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = (this->d->super_QArrayData).flags.
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    pCVar3 = pCVar3 + lVar2;
    (pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar5;
  }
  local_58.size = 0;
  lVar2 = this->size;
  local_58.d = pDVar1;
  local_58.ptr = pCVar3;
  if (lVar2 == 0) {
    local_58.size = 0;
  }
  else if ((this->d == (Data *)0x0) ||
          (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    pCVar9 = this->ptr;
    pCVar7 = pCVar9 + lVar2;
    for (; qVar8 = local_58.size, pCVar9 < pCVar7; pCVar9 = pCVar9 + 1) {
      QArrayDataPointer<char16_t>::QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(pCVar3 + local_58.size),
                 (QArrayDataPointer<char16_t> *)pCVar9);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&pCVar3[qVar8].path.d,&(pCVar9->path).d);
      local_58.size = local_58.size + 1;
    }
  }
  else {
    pCVar9 = this->ptr;
    pCVar7 = pCVar9 + lVar2;
    for (; pCVar9 < pCVar7; pCVar9 = pCVar9 + 1) {
      generateJavaQmlComponents::ComponentInfo::ComponentInfo(pCVar3 + local_58.size,pCVar9);
      local_58.size = local_58.size + 1;
    }
  }
  pDVar1 = this->d;
  pCVar3 = this->ptr;
  this->d = local_58.d;
  this->ptr = local_58.ptr;
  qVar8 = this->size;
  this->size = local_58.size;
  local_58.d = pDVar1;
  local_58.ptr = pCVar3;
  local_58.size = qVar8;
  ~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }